

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmark.cpp
# Opt level: O3

QBenchmarkMeasurerBase * __thiscall QBenchmarkGlobalData::createMeasurer(QBenchmarkGlobalData *this)

{
  undefined *puVar1;
  QBenchmarkEvent *this_00;
  
  switch(this->mode_) {
  case CallgrindParentProcess:
  case CallgrindChildProcess:
    this_00 = (QBenchmarkEvent *)operator_new(8);
    puVar1 = &QBenchmarkCallgrindMeasurer::vtable;
    goto LAB_0011ba09;
  case PerfCounter:
    this_00 = (QBenchmarkEvent *)operator_new(0x20);
    QBenchmarkPerfEventsMeasurer::QBenchmarkPerfEventsMeasurer
              ((QBenchmarkPerfEventsMeasurer *)this_00);
    break;
  case TickCounter:
    this_00 = (QBenchmarkEvent *)operator_new(0x10);
    puVar1 = &QBenchmarkTickMeasurer::vtable;
LAB_0011ba09:
    (this_00->super_QBenchmarkMeasurerBase)._vptr_QBenchmarkMeasurerBase =
         (_func_int **)(puVar1 + 0x10);
    break;
  case EventCounter:
    this_00 = (QBenchmarkEvent *)operator_new(0x20);
    QBenchmarkEvent::QBenchmarkEvent(this_00);
    break;
  default:
    this_00 = (QBenchmarkEvent *)operator_new(0x18);
    (this_00->super_QBenchmarkMeasurerBase)._vptr_QBenchmarkMeasurerBase =
         (_func_int **)&PTR__QBenchmarkMeasurerBase_0016edf0;
    *(undefined8 *)&this_00->super_QAbstractNativeEventFilter = 0x8000000000000000;
    *(undefined8 *)&this_00->field_0x10 = 0x8000000000000000;
  }
  return &this_00->super_QBenchmarkMeasurerBase;
}

Assistant:

QBenchmarkMeasurerBase * QBenchmarkGlobalData::createMeasurer()
{
    QBenchmarkMeasurerBase *measurer = nullptr;
    if (0) {
#if QT_CONFIG(valgrind)
    } else if (mode_ == CallgrindChildProcess || mode_ == CallgrindParentProcess) {
        measurer = new QBenchmarkCallgrindMeasurer;
#endif
#ifdef QTESTLIB_USE_PERF_EVENTS
    } else if (mode_ == PerfCounter) {
        measurer = new QBenchmarkPerfEventsMeasurer;
#endif
#ifdef HAVE_TICK_COUNTER
    } else if (mode_ == TickCounter) {
        measurer = new QBenchmarkTickMeasurer;
#endif
    } else if (mode_ == EventCounter) {
        measurer = new QBenchmarkEvent;
    } else {
        measurer =  new QBenchmarkTimeMeasurer;
    }
    return measurer;
}